

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,char *a_test_case_name,char *a_name,char *a_type_param,char *a_value_param
          ,TypeId fixture_class_id,TestFactoryBase *factory)

{
  TestResult *this_00;
  allocator<char> *in_RCX;
  long in_RDI;
  long in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  allocator<char> *in_stack_ffffffffffffff40;
  allocator<char> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  bool local_63;
  allocator<char> local_62;
  undefined1 local_61;
  TestResult *local_60;
  byte local_53;
  allocator<char> local_52;
  undefined1 local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  undefined8 local_30;
  long local_28;
  allocator<char> *local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<char>::~allocator(local_45);
  local_51 = 0;
  local_53 = 0;
  if (local_20 == (allocator<char> *)0x0) {
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    local_51 = 1;
    in_stack_ffffffffffffff48 = &local_52;
    local_50 = local_c8;
    std::allocator<char>::allocator();
    local_53 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,(char *)in_stack_ffffffffffffff48,local_20);
    in_stack_ffffffffffffff40 = local_20;
    in_stack_ffffffffffffff50 = local_c8;
  }
  local_51 = 0;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RDI + 0x40),local_c8);
  if ((local_53 & 1) != 0) {
    std::allocator<char>::~allocator(&local_52);
  }
  local_61 = 0;
  if (local_28 == 0) {
    this_00 = (TestResult *)0x0;
  }
  else {
    this_00 = (TestResult *)operator_new(0x20);
    local_61 = 1;
    local_60 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40
              );
  }
  local_61 = 0;
  local_63 = local_28 != 0;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RDI + 0x48),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  if (local_63) {
    std::allocator<char>::~allocator(&local_62);
  }
  *(undefined8 *)(in_RDI + 0x50) = local_30;
  *(undefined1 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)(in_RDI + 0x59) = 0;
  *(undefined1 *)(in_RDI + 0x5a) = 0;
  *(undefined8 *)(in_RDI + 0x60) = in_stack_00000008;
  TestResult::TestResult(this_00);
  return;
}

Assistant:

TestInfo::TestInfo(const char* a_test_case_name,
                   const char* a_name,
                   const char* a_type_param,
                   const char* a_value_param,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_case_name_(a_test_case_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      value_param_(a_value_param ? new std::string(a_value_param) : NULL),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      factory_(factory),
      result_() {}